

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimate.cc
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  ostream *poVar4;
  ostringstream *this;
  char *pcVar5;
  bool bVar6;
  int vector_length;
  allocator local_3f1;
  int decimation_period;
  int start_index;
  string local_3e8;
  vector<double,_std::allocator<double>_> input_data;
  ostringstream error_message_6;
  ifstream ifs;
  byte abStack_218 [488];
  
  start_index = 0;
  vector_length = 1;
  decimation_period = 10;
LAB_0010259f:
  do {
    iVar3 = ya_getopt_long(argc,argv,"l:m:s:p:h",(option *)0x0,(int *)0x0);
    switch(iVar3) {
    case 0x68:
      anon_unknown.dwarf_2aed::PrintUsage((ostream *)&std::cout);
      return 0;
    case 0x6c:
      std::__cxx11::string::string((string *)&ifs,ya_optarg,(allocator *)&error_message_6);
      bVar6 = sptk::ConvertStringToInteger((string *)&ifs,&vector_length);
      bVar1 = vector_length < 1;
      std::__cxx11::string::~string((string *)&ifs);
      if (!bVar6 || bVar1) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
        std::operator<<((ostream *)&ifs,"The argument for the -l option must be a positive integer")
        ;
        std::__cxx11::string::string((string *)&error_message_6,"decimate",(allocator *)&local_3e8);
        sptk::PrintErrorMessage((string *)&error_message_6,(ostringstream *)&ifs);
        goto LAB_001028b0;
      }
      break;
    case 0x6d:
      std::__cxx11::string::string((string *)&ifs,ya_optarg,(allocator *)&error_message_6);
      bVar1 = sptk::ConvertStringToInteger((string *)&ifs,&vector_length);
      bVar6 = vector_length < 0;
      std::__cxx11::string::~string((string *)&ifs);
      if (!bVar1 || bVar6) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
        poVar4 = std::operator<<((ostream *)&ifs,"The argument for the -m option must be a ");
        std::operator<<(poVar4,"non-negative integer");
        std::__cxx11::string::string((string *)&error_message_6,"decimate",(allocator *)&local_3e8);
        sptk::PrintErrorMessage((string *)&error_message_6,(ostringstream *)&ifs);
        goto LAB_001028b0;
      }
      vector_length = vector_length + 1;
      break;
    case 0x70:
      std::__cxx11::string::string((string *)&ifs,ya_optarg,(allocator *)&error_message_6);
      bVar6 = sptk::ConvertStringToInteger((string *)&ifs,&decimation_period);
      bVar1 = decimation_period < 1;
      std::__cxx11::string::~string((string *)&ifs);
      if (!bVar6 || bVar1) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
        std::operator<<((ostream *)&ifs,"The argument for the -p option must be a positive integer")
        ;
        std::__cxx11::string::string((string *)&error_message_6,"decimate",(allocator *)&local_3e8);
        sptk::PrintErrorMessage((string *)&error_message_6,(ostringstream *)&ifs);
        goto LAB_001028b0;
      }
      break;
    case 0x73:
      goto switchD_001025c9_caseD_73;
    default:
      if (iVar3 == -1) {
        if (1 < argc - ya_optind) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
          std::operator<<((ostream *)&ifs,"Too many input files");
          std::__cxx11::string::string
                    ((string *)&error_message_6,"decimate",(allocator *)&local_3e8);
          sptk::PrintErrorMessage((string *)&error_message_6,(ostringstream *)&ifs);
          goto LAB_001028b0;
        }
        if (argc == ya_optind) {
          pcVar5 = (char *)0x0;
        }
        else {
          pcVar5 = argv[ya_optind];
        }
        bVar1 = sptk::SetBinaryMode();
        this = (ostringstream *)&ifs;
        if (!bVar1) {
          std::__cxx11::ostringstream::ostringstream(this);
          std::operator<<((ostream *)this,"Cannot set translation mode");
          std::__cxx11::string::string
                    ((string *)&error_message_6,"decimate",(allocator *)&local_3e8);
          sptk::PrintErrorMessage((string *)&error_message_6,(ostringstream *)&ifs);
          goto LAB_001028b0;
        }
        std::ifstream::ifstream(this);
        if ((pcVar5 != (char *)0x0) &&
           (std::ifstream::open((char *)&ifs,(_Ios_Openmode)pcVar5),
           (abStack_218[*(long *)(_ifs + -0x18)] & 5) != 0)) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_6);
          poVar4 = std::operator<<((ostream *)&error_message_6,"Cannot open file ");
          std::operator<<(poVar4,pcVar5);
          std::__cxx11::string::string((string *)&local_3e8,"decimate",(allocator *)&input_data);
          sptk::PrintErrorMessage(&local_3e8,&error_message_6);
          std::__cxx11::string::~string((string *)&local_3e8);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error_message_6);
          iVar3 = 1;
          goto LAB_00102b43;
        }
        cVar2 = std::__basic_file<char>::is_open();
        if (cVar2 == '\0') {
          this = (ostringstream *)&std::cin;
        }
        std::vector<double,_std::allocator<double>_>::vector
                  (&input_data,(long)vector_length,(allocator_type *)&error_message_6);
        iVar3 = -1;
        goto LAB_00102a1a;
      }
    case 0x69:
    case 0x6a:
    case 0x6b:
    case 0x6e:
    case 0x6f:
    case 0x71:
    case 0x72:
      anon_unknown.dwarf_2aed::PrintUsage((ostream *)&std::cerr);
      return 1;
    }
  } while( true );
LAB_00102a94:
  bVar1 = sptk::ReadStream<double>(false,0,0,vector_length,&input_data,(istream *)this,(int *)0x0);
  if (!bVar1) goto LAB_00102ade;
  if (iVar3 % decimation_period == 0) {
    bVar1 = sptk::WriteStream<double>(0,vector_length,&input_data,(ostream *)&std::cout,(int *)0x0);
    iVar3 = 0;
    if (!bVar1) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_6);
      std::operator<<((ostream *)&error_message_6,"Failed to write decimated data sequence");
      std::__cxx11::string::string((string *)&local_3e8,"decimate",&local_3f1);
      sptk::PrintErrorMessage(&local_3e8,&error_message_6);
      goto LAB_00102b22;
    }
  }
  iVar3 = iVar3 + 1;
  goto LAB_00102a94;
LAB_00102ade:
  iVar3 = 0;
  goto LAB_00102b39;
switchD_001025c9_caseD_73:
  std::__cxx11::string::string((string *)&ifs,ya_optarg,(allocator *)&error_message_6);
  bVar1 = sptk::ConvertStringToInteger((string *)&ifs,&start_index);
  bVar6 = start_index < 0;
  std::__cxx11::string::~string((string *)&ifs);
  if (!bVar1 || bVar6) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
    poVar4 = std::operator<<((ostream *)&ifs,"The argument for the -s option must be a ");
    std::operator<<(poVar4,"non-negative integer");
    std::__cxx11::string::string((string *)&error_message_6,"decimate",(allocator *)&local_3e8);
    sptk::PrintErrorMessage((string *)&error_message_6,(ostringstream *)&ifs);
LAB_001028b0:
    std::__cxx11::string::~string((string *)&error_message_6);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ifs);
    return 1;
  }
  goto LAB_0010259f;
  while (bVar1 = sptk::ReadStream<double>
                           (false,0,0,vector_length,&input_data,(istream *)this,(int *)0x0), bVar1)
  {
LAB_00102a1a:
    iVar3 = iVar3 + 1;
    if (start_index <= iVar3) {
      iVar3 = 0;
      goto LAB_00102a94;
    }
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_6);
  std::operator<<((ostream *)&error_message_6,"Start index exceeds data length");
  std::__cxx11::string::string((string *)&local_3e8,"decimate",&local_3f1);
  sptk::PrintErrorMessage(&local_3e8,&error_message_6);
LAB_00102b22:
  std::__cxx11::string::~string((string *)&local_3e8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error_message_6);
  iVar3 = 1;
LAB_00102b39:
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&input_data.super__Vector_base<double,_std::allocator<double>_>);
LAB_00102b43:
  std::ifstream::~ifstream(&ifs);
  return iVar3;
}

Assistant:

int main(int argc, char* argv[]) {
  int start_index(kDefaultStartIndex);
  int vector_length(kDefaultVectorLength);
  int decimation_period(kDefaultDecimationPeriod);

  for (;;) {
    const int option_char(getopt_long(argc, argv, "l:m:s:p:h", NULL, NULL));
    if (-1 == option_char) break;

    switch (option_char) {
      case 'l': {
        if (!sptk::ConvertStringToInteger(optarg, &vector_length) ||
            vector_length <= 0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -l option must be a positive integer";
          sptk::PrintErrorMessage("decimate", error_message);
          return 1;
        }
        break;
      }
      case 'm': {
        if (!sptk::ConvertStringToInteger(optarg, &vector_length) ||
            vector_length < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -m option must be a "
                        << "non-negative integer";
          sptk::PrintErrorMessage("decimate", error_message);
          return 1;
        }
        ++vector_length;
        break;
      }
      case 's': {
        if (!sptk::ConvertStringToInteger(optarg, &start_index) ||
            start_index < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -s option must be a "
                        << "non-negative integer";
          sptk::PrintErrorMessage("decimate", error_message);
          return 1;
        }
        break;
      }
      case 'p': {
        if (!sptk::ConvertStringToInteger(optarg, &decimation_period) ||
            decimation_period <= 0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -p option must be a positive integer";
          sptk::PrintErrorMessage("decimate", error_message);
          return 1;
        }
        break;
      }
      case 'h': {
        PrintUsage(&std::cout);
        return 0;
      }
      default: {
        PrintUsage(&std::cerr);
        return 1;
      }
    }
  }

  const int num_input_files(argc - optind);
  if (1 < num_input_files) {
    std::ostringstream error_message;
    error_message << "Too many input files";
    sptk::PrintErrorMessage("decimate", error_message);
    return 1;
  }
  const char* input_file(0 == num_input_files ? NULL : argv[optind]);

  if (!sptk::SetBinaryMode()) {
    std::ostringstream error_message;
    error_message << "Cannot set translation mode";
    sptk::PrintErrorMessage("decimate", error_message);
    return 1;
  }

  std::ifstream ifs;
  if (NULL != input_file) {
    ifs.open(input_file, std::ios::in | std::ios::binary);
    if (ifs.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << input_file;
      sptk::PrintErrorMessage("decimate", error_message);
      return 1;
    }
  }
  std::istream& input_stream(ifs.is_open() ? ifs : std::cin);

  std::vector<double> input_data(vector_length);

  // Skip data.
  for (int sample_index(0); sample_index < start_index; ++sample_index) {
    if (!sptk::ReadStream(false, 0, 0, vector_length, &input_data,
                          &input_stream, NULL)) {
      std::ostringstream error_message;
      error_message << "Start index exceeds data length";
      sptk::PrintErrorMessage("decimate", error_message);
      return 1;
    }
  }

  for (int sample_index(0); sptk::ReadStream(false, 0, 0, vector_length,
                                             &input_data, &input_stream, NULL);
       ++sample_index) {
    if (0 == sample_index % decimation_period) {
      if (!sptk::WriteStream(0, vector_length, input_data, &std::cout, NULL)) {
        std::ostringstream error_message;
        error_message << "Failed to write decimated data sequence";
        sptk::PrintErrorMessage("decimate", error_message);
        return 1;
      }
      sample_index = 0;
    }
  }

  return 0;
}